

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraUtilPerm.c
# Opt level: O0

int Abc_ZddUniqueCreate(Abc_ZddMan *p,int Var,int True,int False)

{
  int iVar1;
  uint uVar2;
  int *local_30;
  int *q;
  int False_local;
  int True_local;
  int Var_local;
  Abc_ZddMan *p_local;
  
  if ((Var < 0) || (p->nVars <= Var)) {
    __assert_fail("Var >= 0 && Var < p->nVars",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/extra/extraUtilPerm.c"
                  ,0x8f,"int Abc_ZddUniqueCreate(Abc_ZddMan *, int, int, int)");
  }
  iVar1 = Abc_ZddObjVar(p,True);
  if (iVar1 <= Var) {
    __assert_fail("Var < Abc_ZddObjVar(p, True)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/extra/extraUtilPerm.c"
                  ,0x90,"int Abc_ZddUniqueCreate(Abc_ZddMan *, int, int, int)");
  }
  iVar1 = Abc_ZddObjVar(p,False);
  if (iVar1 <= Var) {
    __assert_fail("Var < Abc_ZddObjVar(p, False)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/extra/extraUtilPerm.c"
                  ,0x91,"int Abc_ZddUniqueCreate(Abc_ZddMan *, int, int, int)");
  }
  p_local._4_4_ = False;
  if (True != 0) {
    local_30 = p->pUnique;
    uVar2 = Abc_ZddHash(Var,True,False);
    for (local_30 = local_30 + (uVar2 & p->nUniqueMask); *local_30 != 0;
        local_30 = p->pNexts + *local_30) {
      if ((((*(uint *)(p->pObjs + *local_30) & 0x7fffffff) == Var) &&
          (p->pObjs[*local_30].True == True)) && (p->pObjs[*local_30].False == False)) {
        return *local_30;
      }
    }
    if (p->nObjs == p->nObjsAlloc) {
      printf("Aborting because the number of nodes exceeded %d.\n",(ulong)(uint)p->nObjsAlloc);
      fflush(_stdout);
    }
    if (p->nObjsAlloc <= p->nObjs) {
      __assert_fail("p->nObjs < p->nObjsAlloc",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/extra/extraUtilPerm.c"
                    ,0x9b,"int Abc_ZddUniqueCreate(Abc_ZddMan *, int, int, int)");
    }
    iVar1 = p->nObjs;
    p->nObjs = iVar1 + 1;
    *local_30 = iVar1;
    *(uint *)(p->pObjs + *local_30) =
         *(uint *)(p->pObjs + *local_30) & 0x80000000 | Var & 0x7fffffffU;
    p->pObjs[*local_30].True = True;
    p->pObjs[*local_30].False = False;
    p_local._4_4_ = *local_30;
  }
  return p_local._4_4_;
}

Assistant:

static inline int Abc_ZddUniqueCreate( Abc_ZddMan * p, int Var, int True, int False )
{
    assert( Var >= 0 && Var < p->nVars );
    assert( Var < Abc_ZddObjVar(p, True) );
    assert( Var < Abc_ZddObjVar(p, False) );
    if ( True == 0 )
        return False;
    {
        int *q = p->pUnique + (Abc_ZddHash(Var, True, False) & p->nUniqueMask);
        for ( ; *q; q = p->pNexts + *q )
            if ( p->pObjs[*q].Var == (unsigned)Var && p->pObjs[*q].True == (unsigned)True && p->pObjs[*q].False == (unsigned)False )
                return *q;
        if ( p->nObjs == p->nObjsAlloc )
            printf( "Aborting because the number of nodes exceeded %d.\n", p->nObjsAlloc ), fflush(stdout);
        assert( p->nObjs < p->nObjsAlloc );     
        *q = p->nObjs++;
        p->pObjs[*q].Var = Var;
        p->pObjs[*q].True = True;
        p->pObjs[*q].False = False;
//        printf( "Added node %3d: Var = %3d.  True = %3d.  False = %3d\n", *q, Var, True, False );
        return *q;
    }
}